

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::concat<kj::FixedArray<char,1ul>,kj::CappedArray<char,26ul>>
          (StringTree *__return_storage_ptr__,StringTree *this,FixedArray<char,_1UL> *params,
          CappedArray<char,_26UL> *params_1)

{
  long lVar1;
  size_t sVar2;
  Branch *pBVar3;
  String local_40;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  lVar1 = *(long *)params;
  __return_storage_ptr__->size_ = lVar1 + 1U;
  heapString(&local_40,lVar1 + 1U);
  (__return_storage_ptr__->text).content.ptr = local_40.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_40.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_40.content.disposer;
  pBVar3 = (Branch *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,kj::_::HeapArrayDisposer::
                               Allocate_<kj::StringTree::Branch,_false,_false>::construct,
                      kj::_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  sVar2 = this->size_;
  (__return_storage_ptr__->branches).ptr = pBVar3;
  (__return_storage_ptr__->branches).size_ = 0;
  if (local_40.content.size_ == 0) {
    local_40.content.ptr = (char *)0x0;
  }
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance
  ;
  *local_40.content.ptr = (char)sVar2;
  if (*(size_t *)params != 0) {
    memcpy(local_40.content.ptr + 1,params + 8,*(size_t *)params);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}